

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Logging.cpp
# Opt level: O0

void __thiscall
RenX_LoggingPlugin::RenX_OnExplode(RenX_LoggingPlugin *this,Server *server,string_view object)

{
  bool bVar1;
  __sv_type _Var2;
  undefined1 auVar3 [16];
  code *local_118;
  size_t local_d8;
  char *local_d0;
  size_t local_a8;
  char *local_a0;
  size_t local_78;
  char *local_70;
  undefined1 local_58 [8];
  string msg;
  logFuncType func;
  Server *server_local;
  RenX_LoggingPlugin *this_local;
  string_view object_local;
  
  if ((*(ulong *)&this->field_0xa0 >> 0x17 & 1) == 0) {
    msg.field_2._8_8_ = RenX::Server::sendAdmChan;
  }
  else {
    msg.field_2._8_8_ = RenX::Server::sendLogChan;
  }
  std::__cxx11::string::string((string *)local_58,&this->explodeNoOwnerFmt);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  if (!bVar1) {
    RenX::processTags((string *)local_58,server,(PlayerInfo *)0x0,(PlayerInfo *)0x0,
                      (BuildingInfo *)0x0);
    _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view
                      ((string *)(RenX::tags + 0x14c8));
    auVar3 = RenX::translateName(object._M_len,object._M_str);
    local_78 = _Var2._M_len;
    local_70 = _Var2._M_str;
    RenX::replace_tag(local_58,local_78,local_70,auVar3._0_8_,auVar3._8_8_);
    _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view
                      ((string *)(RenX::tags + 0x14e8));
    auVar3 = RenX::translateName(object._M_len,object._M_str);
    local_a8 = _Var2._M_len;
    local_a0 = _Var2._M_str;
    RenX::replace_tag(local_58,local_a8,local_a0,auVar3._0_8_,auVar3._8_8_);
    if ((msg.field_2._8_8_ & 1) == 0) {
      local_118 = (code *)msg.field_2._8_8_;
    }
    else {
      local_118 = *(code **)(*(long *)server + msg.field_2._8_8_ + -1);
    }
    _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_58);
    local_d8 = _Var2._M_len;
    local_d0 = _Var2._M_str;
    (*local_118)(server,local_d8,local_d0);
  }
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void RenX_LoggingPlugin::RenX_OnExplode(RenX::Server &server, std::string_view object)
{
	logFuncType func;
	if (RenX_LoggingPlugin::explodePublic)
		func = &RenX::Server::sendLogChan;
	else
		func = &RenX::Server::sendAdmChan;

	std::string msg = this->explodeNoOwnerFmt;
	if (!msg.empty())
	{
		RenX::processTags(msg, &server);
		RenX::replace_tag(msg, RenX::tags->INTERNAL_WEAPON_TAG, RenX::translateName(object));
		RenX::replace_tag(msg, RenX::tags->INTERNAL_OBJECT_TAG, RenX::translateName(object));
		(server.*func)(msg);
	}
}